

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O1

void __thiscall cmInstalledFile::Property::~Property(Property *this)

{
  pointer ppcVar1;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<cmCompiledGeneratorExpression*const*,std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>,false>>
            ((this->ValueExpressions).
             super__Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->ValueExpressions).
             super__Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppcVar1 = (this->ValueExpressions).
            super__Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->ValueExpressions).
                                  super__Vector_base<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1
                   );
    return;
  }
  return;
}

Assistant:

cmInstalledFile::Property::~Property()
{
  cmDeleteAll(this->ValueExpressions);
}